

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *vMap,int One,int Two)

{
  int iVar1;
  int local_28;
  int Big;
  int Smo;
  int Two_local;
  int One_local;
  Vec_Int_t *vMap_local;
  
  local_28 = One;
  if (One < Two) {
    local_28 = Two;
    Two = One;
  }
  if (Two != local_28) {
    iVar1 = Vec_IntEntry(vMap,local_28);
    if (iVar1 == -1) {
      Vec_IntWriteEntry(vMap,local_28,Two);
    }
    else {
      iVar1 = Vec_IntEntry(vMap,local_28);
      Gia_ManOrigIdsRemapPairsInsert(vMap,Two,iVar1);
    }
    return;
  }
  __assert_fail("Smo != Big",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                ,0x4b,"void Gia_ManOrigIdsRemapPairsInsert(Vec_Int_t *, int, int)");
}

Assistant:

void Gia_ManOrigIdsRemapPairsInsert( Vec_Int_t * vMap, int One, int Two )
{
    int Smo = One < Two ? One : Two;
    int Big = One < Two ? Two : One;
    assert( Smo != Big );
    if ( Vec_IntEntry(vMap, Big) == -1 )
        Vec_IntWriteEntry( vMap, Big, Smo );
    else
        Gia_ManOrigIdsRemapPairsInsert( vMap, Smo, Vec_IntEntry(vMap, Big) );
}